

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControl::setTextCursor
          (QWidgetTextControl *this,QTextCursor *cursor,bool selectionClipboard)

{
  QWidgetTextControlPrivate *this_00;
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QTextCursor oldSelection;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  this_00->cursorIsFocusIndicator = false;
  iVar1 = QTextCursor::position();
  iVar2 = QTextCursor::position();
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor((QTextCursor *)&local_40,&this_00->cursor);
  QTextCursor::operator=(&this_00->cursor,cursor);
  if (this_00->hasFocus == true) {
    bVar3 = ((this_00->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
             super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x12) != 0;
  }
  else {
    bVar3 = false;
  }
  this_00->cursorOn = bVar3;
  QWidgetTextControlPrivate::_q_updateCurrentCharFormatAndSelection(this_00);
  (**(code **)(*(long *)this + 0x60))(this);
  QWidgetTextControlPrivate::repaintOldAndNewSelection(this_00,(QTextCursor *)&local_40);
  if (iVar1 != iVar2) {
    cursorPositionChanged(this);
  }
  if (selectionClipboard) {
    QWidgetTextControlPrivate::setClipboardSelection(this_00);
  }
  QTextCursor::~QTextCursor((QTextCursor *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::setTextCursor(const QTextCursor &cursor, bool selectionClipboard)
{
    Q_D(QWidgetTextControl);
    d->cursorIsFocusIndicator = false;
    const bool posChanged = cursor.position() != d->cursor.position();
    const QTextCursor oldSelection = d->cursor;
    d->cursor = cursor;
    d->cursorOn = d->hasFocus
            && (d->interactionFlags & (Qt::TextSelectableByKeyboard | Qt::TextEditable));
    d->_q_updateCurrentCharFormatAndSelection();
    ensureCursorVisible();
    d->repaintOldAndNewSelection(oldSelection);
    if (posChanged)
        emit cursorPositionChanged();

#ifndef QT_NO_CLIPBOARD
    if (selectionClipboard)
        d->setClipboardSelection();
#else
    Q_UNUSED(selectionClipboard);
#endif
}